

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O1

void unlock_fd(int fd)

{
  flock sflock;
  
  if (fd != -1) {
    fcntl(fd,6);
  }
  return;
}

Assistant:

void unlock_fd(int fd)
{
    struct flock sflock;
    
    if (fd == -1)
	return;
    
    sflock.l_type = F_UNLCK;
    sflock.l_whence = SEEK_SET;
    sflock.l_start = 0;
    sflock.l_len = 0;
    
    fcntl(fd, F_SETLK, &sflock);
}